

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateEnumDocComment
               (Printer *printer,EnumDescriptor *enum_,int is_descriptor)

{
  undefined4 in_EDX;
  EnumDescriptor *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Printer *unaff_retaddr;
  char *in_stack_00000008;
  Printer *in_stack_00000010;
  EnumDescriptor *in_stack_00000028;
  Printer *in_stack_00000030;
  string local_38 [32];
  undefined4 in_stack_ffffffffffffffe8;
  
  io::Printer::Print<>(unaff_retaddr,(char *)in_RDI);
  GenerateDocCommentBody<google::protobuf::EnumDescriptor>(in_stack_00000030,in_stack_00000028);
  EnumDescriptor::full_name_abi_cxx11_(in_RSI);
  EscapePhpdoc((string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  io::Printer::Print<char[9],std::__cxx11::string>
            (in_stack_00000010,in_stack_00000008,&unaff_retaddr->variable_delimiter_,in_RDI);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void GenerateEnumDocComment(io::Printer* printer, const EnumDescriptor* enum_,
                            int is_descriptor) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, enum_);
  printer->Print(
    " * Protobuf type <code>^fullname^</code>\n"
    " */\n",
    "fullname", EscapePhpdoc(enum_->full_name()));
}